

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Disk::format(Disk *this,Format *new_fmt,Data *data,bool cyls_first)

{
  anon_class_32_4_05df6f5a local_88;
  function<void_(const_CylHead_&)> local_68;
  Range local_48;
  const_iterator local_38;
  const_iterator itEnd;
  const_iterator it;
  bool cyls_first_local;
  Data *data_local;
  Format *new_fmt_local;
  Disk *this_local;
  
  itEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  local_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  local_48 = Format::range(new_fmt);
  local_88.it = &itEnd;
  local_88.itEnd = &local_38;
  local_88.new_fmt = new_fmt;
  local_88.this = this;
  std::function<void(CylHead_const&)>::
  function<Disk::format(Format_const&,Data_const&,bool)::__0,void>
            ((function<void(CylHead_const&)> *)&local_68,&local_88);
  Range::each(&local_48,&local_68,cyls_first);
  std::function<void_(const_CylHead_&)>::~function(&local_68);
  memcpy(&this->fmt,new_fmt,0x3a);
  return;
}

Assistant:

void Disk::format(const Format& new_fmt, const Data& data, bool cyls_first)
{
    auto it = data.begin(), itEnd = data.end();

    new_fmt.range().each([&](const CylHead& cylhead) {
        Track track;
        track.format(cylhead, new_fmt);
        it = track.populate(it, itEnd);
        write(cylhead, std::move(track));
        }, cyls_first);

    // Assign format after formatting as it's cleared by formatting
    fmt = new_fmt;
}